

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O2

void __thiscall
dap::ResponseOrError<dap::VariablesResponse>::~ResponseOrError
          (ResponseOrError<dap::VariablesResponse> *this)

{
  std::__cxx11::string::~string((string *)&this->error);
  std::vector<dap::Variable,_std::allocator<dap::Variable>_>::~vector
            ((vector<dap::Variable,_std::allocator<dap::Variable>_> *)this);
  return;
}

Assistant:

inline ResponseOrError() = default;